

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O1

ObjectPtr __thiscall ICM::DefFunc::BoolCalc::Not::func(Not *this,DataList *list)

{
  byte bVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  long in_RDX;
  
  pp_Var2 = (_func_int **)operator_new(0x10);
  bVar1 = **(byte **)(**(long **)(in_RDX + 8) + 8);
  *pp_Var2 = (_func_int *)0x6;
  pp_Var2[1] = (_func_int *)0x0;
  p_Var3 = (_func_int *)operator_new(1);
  *p_Var3 = (_func_int)(bVar1 ^ 1);
  pp_Var2[1] = p_Var3;
  (this->super_FI)._vptr_FuncInitObject = pp_Var2;
  return (ObjectPtr)(Object *)this;
}

Assistant:

ObjectPtr func(const DataList &list) const {
					return ObjectPtr(new Boolean(!list[0]->dat<T_Boolean>()));
				}